

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinycthread.c
# Opt level: O3

int tss_create(tss_t *key,tss_dtor_t dtor)

{
  int iVar1;
  
  iVar1 = pthread_key_create(key,(__destr_function *)dtor);
  return (int)(iVar1 == 0);
}

Assistant:

int tss_create(tss_t *key, tss_dtor_t dtor)
{
#if defined(_TTHREAD_WIN32_)
  /* FIXME: The destructor function is not supported yet... */
  if (dtor != NULL)
  {
    return thrd_error;
  }
  *key = TlsAlloc();
  if (*key == TLS_OUT_OF_INDEXES)
  {
    return thrd_error;
  }
#else
  if (pthread_key_create(key, dtor) != 0)
  {
    return thrd_error;
  }
#endif
  return thrd_success;
}